

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

void list_object(chunk_conflict *c,object *obj)

{
  size_t len;
  ushort uVar1;
  chunk_conflict2 *pcVar2;
  ulong uVar3;
  object **ppoVar4;
  long lVar5;
  ulong uVar6;
  
  if (obj != (object *)0x0) {
    uVar3 = (ulong)c->obj_max;
    uVar6 = 1;
    do {
      if (uVar3 <= uVar6) {
        for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
          if ((((cave != c) || (player->cave == (chunk_conflict2 *)0x0)) ||
              (player->cave->objects[uVar6] == (object *)0x0)) &&
             (c->objects[uVar6] == (object *)0x0)) {
            c->objects[uVar6] = obj;
            obj->oidx = (uint16_t)uVar6;
            return;
          }
        }
        len = uVar3 * 8 + 0x408;
        ppoVar4 = (object **)mem_realloc(c->objects,len);
        c->objects = ppoVar4;
        uVar1 = c->obj_max;
        *(object **)((long)ppoVar4 + (ulong)((uint)uVar1 * 8)) = obj;
        obj->oidx = uVar1;
        for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
          *(undefined8 *)((long)c->objects + lVar5 * 8 + (ulong)((uint)uVar1 * 8) + 8) = 0;
        }
        c->obj_max = uVar1 + 0x80;
        if (cave != c) {
          return;
        }
        if (player->cave == (chunk_conflict2 *)0x0) {
          return;
        }
        ppoVar4 = (object **)mem_realloc(player->cave->objects,len);
        pcVar2 = player->cave;
        pcVar2->objects = ppoVar4;
        uVar1 = c->obj_max;
        for (uVar6 = (ulong)pcVar2->obj_max; uVar6 <= uVar1; uVar6 = uVar6 + 1) {
          player->cave->objects[uVar6] = (object *)0x0;
        }
        player->cave->obj_max = uVar1;
        return;
      }
      ppoVar4 = c->objects + uVar6;
      uVar6 = uVar6 + 1;
    } while (*ppoVar4 != obj);
  }
  return;
}

Assistant:

void list_object(struct chunk *c, struct object *obj)
{
	int i, newsize;

	/* Check for duplicates and objects already deleted or combined */
	if (!obj) return;
	for (i = 1; i < c->obj_max; i++)
		if (c->objects[i] == obj)
			return;

	/* Put objects in holes in the object list */
	for (i = 1; i < c->obj_max; i++) {
		/* If there is a known object, skip this slot */
		if ((c == cave) && player->cave && player->cave->objects[i]) {
			continue;
		}

		/* Put the object in a hole */
		if (c->objects[i] == NULL) {
			c->objects[i] = obj;
			obj->oidx = i;
			return;
		}
	}

	/* Extend the list */
	newsize = (c->obj_max + OBJECT_LIST_INCR + 1) * sizeof(struct object*);
	c->objects = mem_realloc(c->objects, newsize);
	c->objects[c->obj_max] = obj;
	obj->oidx = c->obj_max;
	for (i = c->obj_max + 1; i <= c->obj_max + OBJECT_LIST_INCR; i++)
		c->objects[i] = NULL;
	c->obj_max += OBJECT_LIST_INCR;

	/* If we're on the current level, extend the known list */
	if ((c == cave) && player->cave) {
		player->cave->objects = mem_realloc(player->cave->objects, newsize);
		for (i = player->cave->obj_max; i <= c->obj_max; i++)
			player->cave->objects[i] = NULL;
		player->cave->obj_max = c->obj_max;
	}
}